

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo_begin_symbol_text
              (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  nk_command_buffer *out;
  float fVar1;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  nk_widget_layout_states nVar4;
  int iVar5;
  long lVar6;
  nk_color foreground;
  nk_context *i;
  nk_style_combo *pnVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect content_00;
  nk_rect b;
  nk_rect header;
  nk_text text;
  nk_rect button;
  nk_rect content;
  nk_rect local_d0;
  nk_symbol_type local_c0;
  int local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  nk_text local_90;
  char *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x611b,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar4 = nk_widget(&local_d0,ctx);
      if (nVar4 == NK_WIDGET_INVALID) {
        iVar5 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar4 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_b8._4_4_ = local_d0.y;
        local_b8._0_4_ = local_d0.x;
        local_a8._4_4_ = local_d0.h;
        local_a8._0_4_ = local_d0.w;
        r.y = local_d0.y;
        r.x = local_d0.x;
        r.w = local_d0.w;
        r.h = local_d0.h;
        local_b8._8_8_ = 0;
        local_a8._8_8_ = 0;
        local_c0 = symbol;
        local_80 = selected;
        iVar5 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        auVar3 = local_a8;
        auVar2 = local_b8;
        if ((ctx->last_widget_state & 0x20) == 0) {
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar7 = &(ctx->style).combo;
            local_90.text = (ctx->style).combo.label_normal;
            foreground = (ctx->style).combo.symbol_normal;
          }
          else {
            pnVar7 = (nk_style_combo *)&(ctx->style).combo.hover;
            local_90.text = (ctx->style).combo.label_hover;
            foreground = (ctx->style).combo.symbol_hover;
          }
        }
        else {
          pnVar7 = (nk_style_combo *)&(ctx->style).combo.active;
          local_90.text = (ctx->style).combo.label_active;
          foreground = (ctx->style).combo.symbol_active;
        }
        local_bc = len;
        local_b8 = auVar2;
        local_a8 = auVar3;
        if ((pnVar7->normal).type == NK_STYLE_ITEM_IMAGE) {
          local_90.background.r = '\0';
          local_90.background.g = '\0';
          local_90.background.b = '\0';
          local_90.background.a = '\0';
          r_00.w = (float)local_a8._0_4_;
          r_00.h = (float)local_a8._4_4_;
          r_00.x = (float)local_b8._0_4_;
          r_00.y = (float)local_b8._4_4_;
          nk_draw_image(&win->buffer,r_00,&(pnVar7->normal).data.image,(nk_color)0xffffffff);
        }
        else {
          local_90.background = (pnVar7->normal).data.color;
          rect_00.w = (float)local_a8._0_4_;
          rect_00.h = (float)local_a8._4_4_;
          rect_00.x = (float)local_b8._0_4_;
          rect_00.y = (float)local_b8._4_4_;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,local_90.background);
          rect.y = local_d0.y;
          rect.x = local_d0.x;
          rect.w = local_d0.w;
          rect.h = local_d0.h;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar6 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar6 = (ulong)(iVar5 != 0) * 8 + 0x1be0;
        }
        local_50.y = (ctx->style).combo.button_padding.y;
        local_50.w = local_d0.h - (local_50.y + local_50.y);
        local_50.x = ((local_d0.x + local_d0.w) - local_d0.h) - (ctx->style).combo.button_padding.x;
        local_a8 = ZEXT416((uint)local_50.x);
        local_50.y = local_50.y + local_d0.y;
        fVar1 = (ctx->style).combo.button.padding.x;
        local_40.x = local_50.x + fVar1;
        fVar8 = (ctx->style).combo.button.padding.y;
        local_40.y = local_50.y + fVar8;
        local_40.w = local_50.w - (fVar1 + fVar1);
        local_40.h = local_50.w - (fVar8 + fVar8);
        out = &win->buffer;
        local_50.h = local_50.w;
        nk_draw_button_symbol
                  (out,&local_50,&local_40,ctx->last_widget_state,&(ctx->style).combo.button,
                   *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar6),
                   (ctx->style).font);
        content_00.x = local_d0.x + (ctx->style).combo.content_padding.x;
        local_b8 = ZEXT416((uint)content_00.x);
        fVar1 = (ctx->style).combo.content_padding.y;
        fVar8 = local_d0.h - (fVar1 + fVar1);
        local_78 = ZEXT416((uint)fVar8);
        content_00.y = local_d0.y + fVar1;
        content_00.h = fVar8;
        content_00.w = fVar8;
        nk_draw_symbol(out,local_c0,content_00,local_90.background,foreground,1.0,(ctx->style).font)
        ;
        local_90.padding.x = 0.0;
        local_90.padding.y = 0.0;
        fVar1 = (ctx->style).combo.content_padding.x;
        b.x = (float)local_78._0_4_ + (float)local_b8._0_4_ + (ctx->style).combo.spacing.x + fVar1;
        fVar8 = (ctx->style).combo.content_padding.y;
        b.y = local_d0.y + fVar8;
        b.h = local_d0.h - (fVar8 + fVar8);
        b.w = ((float)local_a8._0_4_ - fVar1) - b.x;
        nk_widget_text(out,b,local_80,local_bc,&local_90,0x11,(ctx->style).font);
        header_00.y = local_d0.y;
        header_00.x = local_d0.x;
        header_00.w = local_d0.w;
        header_00.h = local_d0.h;
        iVar5 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,(uint)(iVar5 != 0),header_00);
      }
      return iVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x611d,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x611c,
                "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
    enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color symbol_color;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw symbol */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
            1.0f, style->font);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}